

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O2

_Bool consume_pragma(Env *env)

{
  _Bool _Var1;
  _Bool _Var2;
  uint32_t rel;
  
  _Var1 = seq(env,"{-#");
  if (_Var1) {
    while( true ) {
      rel = 0x49e48e;
      _Var2 = seq(env,"#-}");
      if ((_Var2) || (_Var2 = (*env->lexer->eof)(env->lexer), _Var2)) break;
      (env->state->lookahead).offset = (env->state->lookahead).size;
      env->symop = 0;
      advance_over(env,rel);
    }
  }
  return _Var1;
}

Assistant:

static bool consume_pragma(Env *env) {
  if (seq(env, "{-#")) {
    while (!seq(env, "#-}") && not_eof(env)) {
      reset_lookahead(env);
      advance_over(env, 0);
    }
    return true;
  }
  return false;
}